

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::ResizeTest::ResizeTest(ResizeTest *this,EglTestContext *eglTestCtx,ResizeParams *params)

{
  char *name;
  char *description;
  TestLog *pTVar1;
  allocator<char> local_51;
  string local_50;
  ResizeParams *local_20;
  ResizeParams *params_local;
  EglTestContext *eglTestCtx_local;
  ResizeTest *this_local;
  
  local_20 = params;
  params_local = (ResizeParams *)eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  name = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ResizeTest_0326a008;
  tcu::Vector<int,_2>::Vector(&this->m_oldSize,&local_20->oldSize);
  tcu::Vector<int,_2>::Vector(&this->m_newSize,&local_20->newSize);
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  de::details::MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::MovePtr
            (&this->m_nativeWindow);
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::MovePtr
            (&this->m_surface);
  de::details::MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::MovePtr
            (&this->m_context);
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this->m_log = pTVar1;
  pTVar1 = this->m_log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  tcu::ResultCollector::ResultCollector(&this->m_status,pTVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

ResizeTest	(EglTestContext&		eglTestCtx,
											 const ResizeParams&	params)
									: TestCase	(eglTestCtx,
												 params.name.c_str(),
												 params.description.c_str())
									, m_oldSize	(params.oldSize)
									, m_newSize	(params.newSize)
									, m_display	(EGL_NO_DISPLAY)
									, m_config	(DE_NULL)
									, m_log		(m_testCtx.getLog())
									, m_status	(m_log) {}